

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_destroy(filemgr *file)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  sVar1 = file->wal->num_shards;
  lVar2 = 0x10;
  while( true ) {
    bVar3 = sVar1 == 0;
    sVar1 = sVar1 - 1;
    if (bVar3) break;
    pthread_spin_destroy((pthread_spinlock_t *)((long)&(file->wal->key_shards->_map).root + lVar2));
    if (file->config->seqtree_opt == '\x01') {
      pthread_spin_destroy
                ((pthread_spinlock_t *)((long)&(file->wal->seq_shards->_map).root + lVar2));
    }
    lVar2 = lVar2 + 0x18;
  }
  pthread_spin_destroy(&file->wal->lock);
  free(file->wal->key_shards);
  if (file->config->seqtree_opt == '\x01') {
    free(file->wal->seq_shards);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_destroy(struct filemgr *file)
{
    size_t i = 0;
    size_t num_shards = wal_get_num_shards(file);
    // Free all WAL shards
    for (; i < num_shards; ++i) {
        spin_destroy(&file->wal->key_shards[i].lock);
        if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
            spin_destroy(&file->wal->seq_shards[i].lock);
        }
    }
    spin_destroy(&file->wal->lock);
    free(file->wal->key_shards);
    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
        free(file->wal->seq_shards);
    }
    return FDB_RESULT_SUCCESS;
}